

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb_details::internal_node<char,_false>_> __thiscall
immutable::rrb_details::rebalance<char,false,5>
          (rrb_details *this,ref<immutable::rrb_details::internal_node<char,_false>_> *left,
          ref<immutable::rrb_details::internal_node<char,_false>_> *centre,
          ref<immutable::rrb_details::internal_node<char,_false>_> *right,uint32_t shift,bool is_top
          )

{
  internal_node<char,_false> *piVar1;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_a0;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_98;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_90;
  ref<immutable::rrb_details::internal_node<char,_false>_> new_right;
  ref<immutable::rrb_details::internal_node<char,_false>_> new_left;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_78;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_70;
  ref<immutable::rrb_details::internal_node<char,_false>_> new_all;
  undefined1 local_58 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> node_count;
  uint32_t top_len;
  ref<immutable::rrb_details::internal_node<char,_false>_> all;
  bool is_top_local;
  uint32_t shift_local;
  ref<immutable::rrb_details::internal_node<char,_false>_> *right_local;
  ref<immutable::rrb_details::internal_node<char,_false>_> *centre_local;
  ref<immutable::rrb_details::internal_node<char,_false>_> *left_local;
  
  all.ptr._3_1_ = is_top;
  all.ptr._4_4_ = shift;
  piVar1 = internal_node_merge<char,false>(left,centre,right);
  ref<immutable::rrb_details::internal_node<char,_false>_>::ref
            ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&stack0xffffffffffffffc8,
             piVar1);
  create_concat_plan<char,false,5>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,
             (rrb_details *)&stack0xffffffffffffffc8,
             (ref<immutable::rrb_details::internal_node<char,_false>_> *)
             ((long)&node_count.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4),(uint32_t *)right);
  execute_concat_plan<char,false,5>
            ((rrb_details *)&local_70,
             (ref<immutable::rrb_details::internal_node<char,_false>_> *)&stack0xffffffffffffffc8,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,
             node_count.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,all.ptr._4_4_);
  if (node_count.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x21) {
    if ((all.ptr._3_1_ & 1) == 0) {
      set_sizes<char,false,5>((rrb_details *)&local_78,&local_70,all.ptr._4_4_);
      piVar1 = internal_node_new_above1<char,false>(&local_78);
      ref<immutable::rrb_details::internal_node<char,_false>_>::ref
                ((ref<immutable::rrb_details::internal_node<char,_false>_> *)this,piVar1);
      ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&local_78);
    }
    else {
      ref<immutable::rrb_details::internal_node<char,_false>_>::ref
                ((ref<immutable::rrb_details::internal_node<char,_false>_> *)this,&local_70);
    }
  }
  else {
    piVar1 = internal_node_copy<char,false>(local_70.ptr,0,0x20);
    ref<immutable::rrb_details::internal_node<char,_false>_>::ref(&new_right,piVar1);
    piVar1 = internal_node_copy<char,false>
                       (local_70.ptr,0x20,
                        node_count.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ - 0x20);
    ref<immutable::rrb_details::internal_node<char,_false>_>::ref(&local_90,piVar1);
    set_sizes<char,false,5>((rrb_details *)&local_98,&new_right,all.ptr._4_4_);
    set_sizes<char,false,5>((rrb_details *)&local_a0,&local_90,all.ptr._4_4_);
    piVar1 = internal_node_new_above<char,false>(&local_98,&local_a0);
    ref<immutable::rrb_details::internal_node<char,_false>_>::ref
              ((ref<immutable::rrb_details::internal_node<char,_false>_> *)this,piVar1);
    ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&local_a0);
    ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&local_98);
    ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&local_90);
    ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&new_right);
  }
  ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&local_70);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  ref<immutable::rrb_details::internal_node<char,_false>_>::~ref
            ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&stack0xffffffffffffffc8);
  return (ref<immutable::rrb_details::internal_node<char,_false>_>)
         (internal_node<char,_false> *)this;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>> rebalance(const ref<internal_node<T, atomic_ref_counting>>& left, const ref<internal_node<T, atomic_ref_counting>>& centre, const ref<internal_node<T, atomic_ref_counting>>& right, uint32_t shift, bool is_top)
      {
      ref<internal_node<T, atomic_ref_counting>> all = internal_node_merge(left, centre, right);
      // top_len is children count of the internal node returned.
      uint32_t top_len; // populated through pointer manipulation.

      std::vector<uint32_t> node_count = create_concat_plan<T, atomic_ref_counting, N>(all, &top_len);

      ref<internal_node<T, atomic_ref_counting>> new_all = execute_concat_plan<T, atomic_ref_counting, N>(all, node_count, top_len, shift);
      if (top_len <= bits<N>::rrb_branching)
        {
        if (is_top == false)
          {
          return internal_node_new_above1(set_sizes<T, atomic_ref_counting, N>(new_all, shift));
          }
        else
          {
          return new_all;
          }
        }
      else
        {
        ref<internal_node<T, atomic_ref_counting>> new_left = internal_node_copy(new_all.ptr, 0, bits<N>::rrb_branching);
        ref<internal_node<T, atomic_ref_counting>> new_right = internal_node_copy(new_all.ptr, bits<N>::rrb_branching, top_len - bits<N>::rrb_branching);
        return internal_node_new_above<T, atomic_ref_counting>(set_sizes<T, atomic_ref_counting, N>(new_left, shift), set_sizes<T, atomic_ref_counting, N>(new_right, shift));
        }
      }